

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppPVar1;
  char cVar2;
  ushort uVar3;
  undefined4 uVar4;
  pointer pDVar5;
  double dVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined2 uVar11;
  bool bVar12;
  _Alloc_hider *p_Var13;
  UINT8 UVar14;
  undefined2 uVar15;
  PlayerBase *pPVar16;
  pointer pPVar17;
  short sVar18;
  AUDDRV_INFO *pAVar19;
  UINT8 UVar20;
  byte bVar21;
  UINT32 UVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  AUDIO_OPTS *pAVar27;
  VGMPlayer *pVVar28;
  S98Player *pSVar29;
  DROPlayer *pDVar30;
  GYMPlayer *pGVar31;
  Config *pCVar32;
  char *pcVar33;
  char *pcVar34;
  DATA_LOADER *pDVar35;
  PlayerBase *pPVar36;
  S98_HEADER *pSVar37;
  VGM_HEADER *pVVar38;
  DRO_HEADER *pDVar39;
  undefined4 extraout_var;
  vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_> *pvVar40;
  AUDIO_OPTS *pAVar41;
  void *drvObj;
  size_t sVar42;
  ulong uVar43;
  string *psVar44;
  UINT32 UVar45;
  char *pcVar46;
  double *pdVar47;
  size_type __new_size;
  undefined4 in_register_0000003c;
  FILE *drvStruct;
  int iVar48;
  char *pcVar49;
  ulong uVar50;
  long lVar51;
  char **ppcVar52;
  DACSTRM_DEV *strmDev;
  char *pcVar53;
  string *psVar54;
  UINT32 drvID;
  string *psVar55;
  bool bVar56;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  string *local_1c8;
  PlayerBase *local_1c0;
  PlayerBase *local_1b8;
  char *local_1b0;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> diList;
  undefined1 local_189;
  string result;
  AUDDRV_INFO *drvInfo;
  undefined8 uStack_f0;
  AUDDRV_INFO local_e8;
  undefined8 local_d8;
  INT16 aIStack_d0 [4];
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  __fd_mask local_b8;
  __fd_mask _Stack_b0;
  __fd_mask local_a8;
  __fd_mask _Stack_a0;
  __fd_mask local_98;
  __fd_mask _Stack_90;
  __fd_mask local_88;
  __fd_mask _Stack_80;
  char **local_50;
  undefined8 local_48;
  int local_3c;
  DATA_LOADER *local_38;
  undefined4 uVar8;
  undefined3 uVar10;
  
  local_48 = CONCAT44(in_register_0000003c,argc);
  if (argc < 2) {
    printf("Usage: %s inputfile\n",*argv);
    return 0;
  }
  OSMutex_Init(&renderMtx,'\0');
  puts("Opening Audio Device ...");
  UVar20 = Audio_Init();
  if (UVar20 != ' ') {
    local_50 = argv;
    UVar22 = Audio_GetDriverCount();
    if (UVar22 == 0) {
      UVar45 = 0xffffffff;
    }
    else {
      iVar48 = 0;
      UVar45 = 0xffffffff;
      drvID = 0;
      do {
        Audio_GetDriverInfo(drvID,&drvInfo);
        if (drvInfo->drvType == '\x01') {
          UVar45 = drvID;
          if (iVar48 == -2) break;
          iVar48 = iVar48 + 1;
        }
        drvID = drvID + 1;
      } while (UVar22 != drvID);
    }
    if (UVar45 == 0xffffffff) {
      main_cold_5();
    }
    else {
      audDrv = (void *)0x0;
      Audio_GetDriverInfo(UVar45,(AUDDRV_INFO **)&result);
      printf("Using driver %s.\n",*(undefined8 *)(result._M_dataplus._M_p + 8));
      UVar20 = AudioDrv_Init(UVar45,&audDrv);
      if (UVar20 == '\0') {
        audDrvLog = (void *)0x0;
        if (audDrv == (void *)0x0) {
          pAVar27 = (AUDIO_OPTS *)0x0;
        }
        else {
          pAVar27 = AudioDrv_GetOptions(audDrv);
        }
        ppcVar52 = local_50;
        if (pAVar27 == (AUDIO_OPTS *)0x0) {
LAB_0010ee29:
          DeinitAudioSystem();
          return 1;
        }
        pAVar27->sampleRate = 0xac44;
        pAVar27->numChannels = '\x02';
        pAVar27->numBitsPerSmpl = '\x10';
        if (audDrv == (void *)0x0) {
          __new_size = 0xac44;
          UVar22 = 0x2b11;
        }
        else {
          printf("Opening Device %u ...\n");
          UVar20 = AudioDrv_Start(audDrv,0);
          if (UVar20 != '\0') {
            main_cold_2();
            goto LAB_0010ee29;
          }
          UVar22 = AudioDrv_GetBufferSize(audDrv);
          UVar22 = UVar22 >> 2;
          __new_size = 0;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&locAudBuf,__new_size);
        PlayerA::SetOutputSettings
                  (&mainPlr,pAVar27->sampleRate,pAVar27->numChannels,pAVar27->numBitsPerSmpl,UVar22)
        ;
        playState = '\0';
        pVVar28 = (VGMPlayer *)operator_new(0x6a40);
        VGMPlayer::VGMPlayer(pVVar28);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pVVar28);
        pSVar29 = (S98Player *)operator_new(0x1eb0);
        S98Player::S98Player(pSVar29);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pSVar29);
        pDVar30 = (DROPlayer *)operator_new(0x3f8);
        DROPlayer::DROPlayer(pDVar30);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pDVar30);
        pGVar31 = (GYMPlayer *)operator_new(0x330);
        GYMPlayer::GYMPlayer(pGVar31);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pGVar31);
        PlayerA::SetEventCallback(&mainPlr,FilePlayCallback,(void *)0x0);
        PlayerA::SetFileReqCallback(&mainPlr,RequestFileCallback,(void *)0x0);
        PlayerA::SetLogCallback(&mainPlr,PlayerLogCallback,(void *)0x0);
        pCVar32 = PlayerA::GetConfiguration(&mainPlr);
        uVar7 = pCVar32->ignoreVolGain;
        uVar9 = pCVar32->chnInvert;
        uVar11 = *(undefined2 *)&pCVar32->field_0x6;
        uVar10 = CONCAT21(uVar11,uVar9);
        uVar8 = CONCAT31(uVar10,uVar7);
        drvInfo = (AUDDRV_INFO *)CONCAT44(uVar8,0x10000);
        uStack_f0 = 0x2b11000000002;
        local_e8._4_4_ = SUB84((ulong)*(undefined8 *)&pCVar32->endSilenceSmpls >> 0x20,0);
        local_e8._0_4_ = 0x5622;
        local_e8.drvName = (char *)0x3ff0000000000000;
        PlayerA::SetConfiguration(&mainPlr,(Config *)&drvInfo);
        local_3c = (int)local_48 + -1;
        iVar48 = 1;
        do {
          pcVar46 = ppcVar52[iVar48];
          pcVar33 = strrchr(pcVar46,0x2f);
          pcVar34 = strrchr(pcVar46,0x5c);
          if (pcVar33 < pcVar34) {
            pcVar33 = pcVar34;
          }
          pcVar34 = pcVar33 + 1;
          if (pcVar33 == (char *)0x0) {
            pcVar34 = pcVar46;
          }
          printf("Loading %s ...  ",pcVar34);
          fflush(_stdout);
          pDVar35 = FileLoader_Init(ppcVar52[iVar48]);
          if (pDVar35 != (DATA_LOADER *)0x0) {
            DataLoader_SetPreloadBytes(pDVar35,0x100);
            UVar20 = DataLoader_Load(pDVar35);
            if (UVar20 == '\0') {
              UVar20 = PlayerA::LoadFile(&mainPlr,pDVar35);
              if (UVar20 == '\0') {
                pPVar36 = PlayerA::GetPlayer(&mainPlr);
                PlayerA::SetLoopCount(&mainPlr,2);
                iVar23 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                local_1b8 = pPVar36;
                if (iVar23 == 0x53393800) {
                  pSVar29 = (S98Player *)
                            __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&S98Player::typeinfo,0);
                  pSVar37 = S98Player::GetFileHeader(pSVar29);
                  bVar21 = pSVar37->fileVer;
                  uVar24 = (*pPVar36->_vptr_PlayerBase[0x1c])(pPVar36);
                  (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar24);
                  local_1b0 = (char *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                  uVar24 = (*pPVar36->_vptr_PlayerBase[0x1d])(pPVar36);
                  (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar24);
                  printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u",
                         (int)local_1b0,extraout_XMM0_Da_00,(ulong)bVar21,(ulong)pSVar37->tickMult);
                }
                else {
                  iVar23 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                  if (iVar23 == 0x56474d00) {
                    pVVar28 = (VGMPlayer *)
                              __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&VGMPlayer::typeinfo,0);
                    pVVar38 = VGMPlayer::GetFileHeader(pVVar28);
                    uVar24 = pVVar38->fileVer;
                    uVar25 = (*local_1b8->_vptr_PlayerBase[0x1c])(local_1b8);
                    (*local_1b8->_vptr_PlayerBase[0x17])(local_1b8,(ulong)uVar25);
                    local_1b0 = (char *)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_01);
                    uVar25 = (*local_1b8->_vptr_PlayerBase[0x1d])(local_1b8);
                    (*local_1b8->_vptr_PlayerBase[0x17])(local_1b8,(ulong)uVar25);
                    pPVar36 = local_1b8;
                    printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s",(int)local_1b0,
                           extraout_XMM0_Da_02,(ulong)uVar24);
                    UVar22 = VGMPlayer::GetModifiedLoopCount(pVVar28,2);
                    PlayerA::SetLoopCount(&mainPlr,UVar22);
                  }
                  else {
                    iVar23 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                    if (iVar23 == 0x44524f00) {
                      pDVar30 = (DROPlayer *)
                                __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&DROPlayer::typeinfo,0)
                      ;
                      pDVar39 = DROPlayer::GetFileHeader(pDVar30);
                      pPVar36 = local_1b8;
                      pcVar46 = "unknown";
                      if ((ulong)pDVar39->hwType < 3) {
                        pcVar46 = &DAT_0017368c +
                                  *(int *)(&DAT_0017368c + (ulong)pDVar39->hwType * 4);
                      }
                      uVar3 = pDVar39->verMajor;
                      uVar24 = (*local_1b8->_vptr_PlayerBase[0x1c])(local_1b8);
                      (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar24);
                      printf("DRO v%u, Total Length: %.2f s, HW Type: %s",(ulong)uVar3,pcVar46);
                    }
                  }
                }
                local_38 = pDVar35;
                if (showTags != '\0') {
                  iVar23 = (*pPVar36->_vptr_PlayerBase[7])(pPVar36);
                  pcVar46 = *(char **)CONCAT44(extraout_var,iVar23);
                  if (pcVar46 == (char *)0x0) {
                    pcVar34 = (char *)0x0;
                    pcVar49 = (char *)0x0;
                    pcVar53 = (char *)0x0;
                    local_1c0 = (PlayerBase *)0x0;
                    local_1b0 = (char *)0x0;
                    pcVar33 = (char *)0x0;
                  }
                  else {
                    pdVar47 = (double *)((long *)CONCAT44(extraout_var,iVar23) + 1);
                    pcVar33 = (char *)0x0;
                    local_1b0 = (char *)0x0;
                    local_1c0 = (PlayerBase *)0x0;
                    pcVar53 = (char *)0x0;
                    pcVar49 = (char *)0x0;
                    pcVar34 = (char *)0x0;
                    do {
                      iVar23 = strcmp(pcVar46,"TITLE");
                      if (iVar23 == 0) {
                        pcVar33 = (char *)*pdVar47;
                      }
                      else {
                        iVar23 = strcmp(pcVar46,"ARTIST");
                        if (iVar23 == 0) {
                          pcVar34 = (char *)*pdVar47;
                        }
                        else {
                          iVar23 = strcmp(pcVar46,"GAME");
                          if (iVar23 == 0) {
                            pcVar49 = (char *)*pdVar47;
                          }
                          else {
                            iVar23 = strcmp(pcVar46,"SYSTEM");
                            if (iVar23 == 0) {
                              pcVar53 = (char *)*pdVar47;
                            }
                            else {
                              iVar23 = strcmp(pcVar46,"DATE");
                              if (iVar23 == 0) {
                                local_1c0 = (PlayerBase *)*pdVar47;
                              }
                              else {
                                iVar23 = strcmp(pcVar46,"COMMENT");
                                if (iVar23 == 0) {
                                  local_1b0 = (char *)*pdVar47;
                                }
                              }
                            }
                          }
                        }
                      }
                      pcVar46 = (char *)pdVar47[1];
                      pdVar47 = pdVar47 + 2;
                    } while (pcVar46 != (char *)0x0);
                  }
                  if ((pcVar33 != (char *)0x0) && (*pcVar33 != '\0')) {
                    printf("\nSong Title: %s",pcVar33);
                  }
                  pcVar46 = local_1b0;
                  pPVar36 = local_1b8;
                  if (1 < showTags) {
                    if ((pcVar34 != (char *)0x0) && (*pcVar34 != '\0')) {
                      printf("\nSong Author: %s",pcVar34);
                    }
                    if ((pcVar49 != (char *)0x0) && (*pcVar49 != '\0')) {
                      printf("\nSong Game: %s",pcVar49);
                    }
                    pPVar16 = local_1c0;
                    if ((pcVar53 != (char *)0x0) && (*pcVar53 != '\0')) {
                      printf("\nSong System: %s",pcVar53);
                    }
                    if ((pPVar16 != (PlayerBase *)0x0) &&
                       (*(char *)&pPVar16->_vptr_PlayerBase != '\0')) {
                      printf("\nSong Date: %s",pPVar16);
                    }
                    if ((pcVar46 != (char *)0x0) && (*pcVar46 != '\0')) {
                      printf("\nSong Comment: %s",pcVar46);
                    }
                  }
                }
                putchar(10);
                iVar23 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x80000000,&drvInfo);
                if (-1 < (char)iVar23) {
                  if ((int)drvInfo == 0) {
                    drvInfo = (AUDDRV_INFO *)CONCAT44(drvInfo._4_4_,0x4d41584d);
                  }
                  local_d8 = 0x80ff800000;
                  (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x80000000,&drvInfo);
                }
                iVar23 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x80000001,&drvInfo);
                if (-1 < (char)iVar23) {
                  uStack_c8 = 0xffa00000;
                  uStack_c4 = 0x60;
                  uStack_c0 = 0xc0ff40;
                  local_d8 = 0x80ff800100ff00;
                  aIStack_d0[0] = -0x40;
                  aIStack_d0[1] = 0x40;
                  aIStack_d0[2] = -0xc0;
                  aIStack_d0[3] = 0xc0;
                  (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x80000001,&drvInfo);
                }
                iVar23 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x80000012,&drvInfo);
                if (-1 < (char)iVar23) {
                  uVar43 = (ulong)local_d8 >> 0x20;
                  local_d8 = CONCAT44((uint)uVar43 & 0xffff0000,0x80ff80);
                  (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x80000012,&drvInfo);
                }
                iVar23 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x8000001b,&drvInfo);
                if (-1 < (char)iVar23) {
                  if ((int)drvInfo == 0) {
                    drvInfo = (AUDDRV_INFO *)CONCAT44(drvInfo._4_4_,0x4d414d45);
                  }
                  (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x8000001b,&drvInfo);
                }
                PlayerA::Start(&mainPlr);
                if (showFileInfo == true) {
                  diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  (*pPVar36->_vptr_PlayerBase[8])(pPVar36,&drvInfo);
                  (*pPVar36->_vptr_PlayerBase[9])(pPVar36,&diList);
                  pAVar19 = drvInfo;
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct((ulong)&result,'\x04');
                  *result._M_dataplus._M_p = (char)((ulong)pAVar19 >> 0x18);
                  result._M_dataplus._M_p[1] = (char)((ulong)pAVar19 >> 0x10);
                  result._M_dataplus._M_p[2] = (char)((ulong)pAVar19 >> 8);
                  result._M_dataplus._M_p[3] = (char)pAVar19;
                  printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
                         result._M_dataplus._M_p,(ulong)drvInfo >> 0x20 & 0xffff,
                         (ulong)drvInfo >> 0x30,uStack_f0 & 0xffffffff,uStack_f0 >> 0x20,
                         local_e8._0_8_ & 0xffffffff,(ulong)local_e8._0_8_ >> 0x20,
                         (ulong)local_e8.drvName >> 0x20);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  if (diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl
                      .super__Vector_impl_data._M_finish !=
                      diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl
                      .super__Vector_impl_data._M_start) {
                    lVar51 = 0x10;
                    pcVar46 = (char *)0x0;
                    do {
                      pPVar17 = diList.
                                super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      uVar24 = *(uint *)((long)diList.
                                               super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        lVar51 + -0x10);
                      local_1c0 = (PlayerBase *)
                                  CONCAT44(local_1c0._4_4_,
                                           (uint)*(byte *)((long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar51 + -0xc));
                      cVar2 = *(char *)((long)diList.
                                              super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar51 + -0xb);
                      uVar4 = *(undefined4 *)
                               ((long)diList.
                                      super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar51 + -8);
                      local_1b0 = pcVar46;
                      result._M_dataplus._M_p = (pointer)&result.field_2;
                      std::__cxx11::string::_M_construct((ulong)&result,'\x04');
                      *result._M_dataplus._M_p = (char)((uint)uVar4 >> 0x18);
                      result._M_dataplus._M_p[1] = (char)((uint)uVar4 >> 0x10);
                      result._M_dataplus._M_p[2] = (char)((uint)uVar4 >> 8);
                      result._M_dataplus._M_p[3] = (char)uVar4;
                      printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
                             (ulong)uVar24,(ulong)local_1c0 & 0xffffffff,(ulong)(uint)(int)cVar2,
                             result._M_dataplus._M_p,
                             (ulong)*(uint *)(*(long *)((long)&pPVar17->id + lVar51) + 8),
                             (ulong)*(uint *)((long)pPVar17 + lVar51 + -4),
                             (ulong)*(ushort *)((long)pPVar17 + lVar51 + -10));
                      pcVar46 = local_1b0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)result._M_dataplus._M_p != &result.field_2) {
                        operator_delete(result._M_dataplus._M_p,
                                        result.field_2._M_allocated_capacity + 1);
                      }
                      pcVar46 = pcVar46 + 1;
                      lVar51 = lVar51 + 0x18;
                      pPVar36 = local_1b8;
                    } while (pcVar46 < (char *)(((long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                               -0x5555555555555555));
                  }
                  if (diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl
                      .super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(diList.
                                    super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)diList.
                                          super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)diList.
                                          super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                iVar23 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                if (iVar23 == 0x56474d00) {
                  pVVar28 = (VGMPlayer *)
                            __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&VGMPlayer::typeinfo);
                  pvVar40 = VGMPlayer::GetStreamDevInfo(pVVar28);
                }
                else {
                  pvVar40 = (vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                             *)0x0;
                }
                if (audDrvLog != (void *)0x0) {
                  pAVar27 = AudioDrv_GetOptions(audDrvLog);
                  if (audDrv != (void *)0x0) {
                    pAVar41 = AudioDrv_GetOptions(audDrv);
                    UVar20 = pAVar41->numChannels;
                    UVar14 = pAVar41->numBitsPerSmpl;
                    uVar15 = *(undefined2 *)&pAVar41->field_0x6;
                    UVar22 = pAVar41->usecPerBuf;
                    UVar45 = pAVar41->numBuffers;
                    pAVar27->sampleRate = pAVar41->sampleRate;
                    pAVar27->numChannels = UVar20;
                    pAVar27->numBitsPerSmpl = UVar14;
                    *(undefined2 *)&pAVar27->field_0x6 = uVar15;
                    pAVar27->usecPerBuf = UVar22;
                    pAVar27->numBuffers = UVar45;
                  }
                  drvObj = AudioDrv_GetDrvData(audDrvLog);
                  WavWrt_SetFileName(drvObj,"waveOut.wav");
                  UVar20 = AudioDrv_Start(audDrvLog,0);
                  if (audDrv != (void *)0x0 && UVar20 == '\0') {
                    AudioDrv_DataForward_Add(audDrv,audDrvLog);
                  }
                }
                if (audDrv == (void *)0x0) {
                  local_1b0 = (char *)CONCAT71(local_1b0._1_7_,1);
                }
                else {
                  UVar20 = AudioDrv_SetCallback(audDrv,FillBuffer,&mainPlr);
                  local_1b0 = (char *)CONCAT71(local_1b0._1_7_,UVar20 != '\0');
                }
                drvStruct = (FILE *)0x1;
                changemode('\x01');
                playState = playState & 0xfd;
                bVar12 = true;
                do {
                  if ((playState & 4) == 0) {
                    bVar12 = true;
                  }
                  if (bVar12) {
                    pcVar46 = "Paused";
                    if ((playState & 4) == 0) {
                      bVar21 = PlayerA::GetState(&mainPlr);
                      pcVar46 = "Finish ";
                      if ((bVar21 & 2) == 0) {
                        bVar21 = PlayerA::GetState(&mainPlr);
                        pcVar46 = "Fading ";
                        if ((bVar21 & 0x10) == 0) {
                          pcVar46 = "Playing";
                        }
                      }
                    }
                    if ((pvVar40 ==
                         (vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_> *)
                         0x0) || (pDVar5 = (pvVar40->
                                           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                           )._M_impl.super__Vector_impl_data._M_start,
                                 pDVar5 == (pvVar40->
                                           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                           )._M_impl.super__Vector_impl_data._M_finish)) {
                      local_1c0 = (PlayerBase *)PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                      dVar6 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                      printf("%s %.2f / %.2f ...   \r",(int)local_1c0,SUB84(dVar6,0),pcVar46);
                    }
                    else {
                      drvInfo = &local_e8;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&drvInfo," ","");
                      if ((pDVar5->pbMode & 0x10) != 0) {
                        std::__cxx11::string::push_back((char)&drvInfo);
                      }
                      if ((char)pDVar5->pbMode < '\0') {
                        std::__cxx11::string::push_back((char)&drvInfo);
                      }
                      if (uStack_f0 == 1) {
                        std::__cxx11::string::_M_replace((ulong)&drvInfo,0,(char *)0x1,0x179573);
                      }
                      local_1c0 = (PlayerBase *)PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                      dVar6 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                      printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",(int)local_1c0
                             ,SUB84(dVar6,0),(double)pDVar5->freq / 1000.0,pcVar46,
                             (ulong)(pDVar5->lastItem + 1),(ulong)pDVar5->maxItems,drvInfo);
                      if (drvInfo != &local_e8) {
                        operator_delete(drvInfo,local_e8._0_8_ + 1);
                      }
                    }
                    drvStruct = _stdout;
                    fflush(_stdout);
                    bVar12 = false;
                  }
                  if (((char)local_1b0 == '\0') || ((playState & 4) != 0)) {
                    usleep(50000);
                  }
                  else {
                    UVar22 = FillBuffer(drvStruct,&mainPlr,
                                        (int)locAudBuf.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                        (int)locAudBuf.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                        locAudBuf.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    AudioDrv_WriteData(audDrvLog,UVar22,
                                       locAudBuf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                  }
                  result._M_dataplus._M_p = (pointer)0x0;
                  result._M_string_length = 0;
                  uStack_f0 = 0;
                  local_e8.drvType = '\0';
                  local_e8.drvSig = '\0';
                  local_e8._2_6_ = 0;
                  local_e8.drvName = (char *)0x0;
                  local_d8 = 0;
                  aIStack_d0[0] = 0;
                  aIStack_d0[1] = 0;
                  aIStack_d0[2] = 0;
                  aIStack_d0[3] = 0;
                  uStack_c8 = 0;
                  uStack_c4 = 0;
                  uStack_c0 = 0;
                  uStack_bc = 0;
                  local_b8 = 0;
                  _Stack_b0 = 0;
                  local_a8 = 0;
                  _Stack_a0 = 0;
                  local_98 = 0;
                  _Stack_90 = 0;
                  local_88 = 0;
                  _Stack_80 = 0;
                  drvInfo = (AUDDRV_INFO *)0x1;
                  drvStruct = (FILE *)0x1;
                  select(1,(fd_set *)&drvInfo,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&result);
                  if (((ulong)drvInfo & 1) != 0) {
                    uVar24 = getchar();
                    drvStruct = (FILE *)(ulong)uVar24;
                    uVar25 = toupper(uVar24);
                    if (uVar25 == 0x20) {
LAB_0010dc4e:
                      playState = playState ^ 4;
                      bVar12 = true;
                      drvStruct = (FILE *)audDrv;
                      if (audDrv != (void *)0x0) {
                        if ((playState & 4) == 0) {
                          AudioDrv_Resume(audDrv);
                        }
                        else {
                          AudioDrv_Pause(audDrv);
                        }
                      }
                    }
                    else {
                      if (uVar25 == 0x52) {
                        OSMutex_Lock(renderMtx);
                        PlayerA::Reset(&mainPlr);
                      }
                      else {
                        if (uVar25 == 0x50) goto LAB_0010dc4e;
                        if (9 < uVar25 - 0x30) {
                          if (uVar25 == 0x4e) {
                            bVar12 = true;
                            if (iVar48 + 1 < (int)local_48) {
                              playState = playState | 2;
                            }
                          }
                          else if (uVar25 == 0x42) {
                            bVar12 = true;
                            if (1 < iVar48) {
                              playState = playState | 2;
                              bVar12 = true;
                              iVar48 = iVar48 + -2;
                            }
                          }
                          else if (uVar24 == 0x1b || uVar25 == 0x51) {
                            playState = playState | 2;
                            bVar12 = true;
                            iVar48 = local_3c;
                          }
                          else {
                            bVar12 = true;
                            if (uVar25 == 0x43) {
                              iVar23 = 0;
                              changemode('\0');
                              local_1c0 = PlayerA::GetPlayer(&mainPlr);
                              printf("Command Mode. ");
                              local_1b8 = (PlayerBase *)0xffffffff;
LAB_0010ddc7:
                              if (iVar23 < 0) goto LAB_0010ed0b;
                              if (iVar23 == 1) {
                                iVar23 = (*local_1c0->_vptr_PlayerBase[0xb])
                                                   (local_1c0,local_1b8,&drvInfo);
                                if ((char)iVar23 < '\0') {
                                  iVar23 = 0;
                                  goto LAB_0010ddc7;
                                }
                                printf("Command [C/LC/O/SRM/SR/RSM/M data]: ");
                                fgets((char *)&result,0x80,_stdin);
                                psVar44 = (string *)&local_189;
                                do {
                                  p_Var13 = &psVar44->_M_dataplus;
                                  psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                do {
                                  psVar55 = psVar44;
                                  if (psVar55 <= &result) break;
                                  iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2._M_local_buf[0xf]
                                                  );
                                  psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                                } while (iVar23 != 0);
                                *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                                psVar44 = &result;
                                strtok((char *)psVar44," ");
                                if ((byte)result._M_dataplus._M_p != 0) {
                                  psVar44 = &result;
                                  bVar21 = (byte)result._M_dataplus._M_p;
                                  do {
                                    iVar23 = toupper((uint)bVar21);
                                    *(char *)&(psVar44->_M_dataplus)._M_p = (char)iVar23;
                                    bVar21 = *(byte *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                    psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                  } while (bVar21 != 0);
                                }
                                psVar55 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                sVar18 = (short)result._M_dataplus._M_p;
                                local_1c8 = psVar44;
                                if ((short)result._M_dataplus._M_p == 0x43) {
                                  diList.
                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                  _M_impl.super__Vector_impl_data._M_start =
                                       (pointer)&diList.
                                                 super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  sVar42 = strlen((char *)psVar55);
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&diList,psVar55,
                                             (long)&(psVar55->_M_dataplus)._M_p + sVar42);
                                  std::__cxx11::string::resize((ulong)&diList,'\x04');
                                  drvInfo = (AUDDRV_INFO *)
                                            CONCAT44(drvInfo._4_4_,
                                                     (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                                  ) | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                                  ) << 8 | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                                  ) << 0x10 |
                                                  (uint)(byte)(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id <<
                                                  0x18);
                                  (*local_1c0->_vptr_PlayerBase[10])(local_1c0,local_1b8,&drvInfo);
LAB_0010e174:
                                  if (diList.
                                      super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                      ._M_impl.super__Vector_impl_data._M_start !=
                                      (pointer)&diList.
                                                super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                  {
                                    operator_delete(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (ulong)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 1));
                                  }
                                }
                                else {
                                  iVar23 = (int)result._M_dataplus._M_p;
                                  if (result._M_dataplus._M_p._2_1_ == '\0' && sVar18 == 0x434c) {
                                    diList.
                                    super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                    _M_impl.super__Vector_impl_data._M_start =
                                         (pointer)&diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                    ;
                                    sVar42 = strlen((char *)psVar55);
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&diList,psVar55,
                                               (long)&(psVar55->_M_dataplus)._M_p + sVar42);
                                    std::__cxx11::string::resize((ulong)&diList,'\x04');
                                    drvInfo = (AUDDRV_INFO *)
                                              CONCAT44((int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                                  ) | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                                  ) << 8 | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                                  ) << 0x10 |
                                                  (uint)(byte)(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id <<
                                                  0x18,(int)drvInfo);
                                    (*local_1c0->_vptr_PlayerBase[10])(local_1c0,local_1b8,&drvInfo)
                                    ;
                                    goto LAB_0010e174;
                                  }
                                  if (sVar18 == 0x4f) {
                                    uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                    local_e8._0_4_ = (int)uVar43;
LAB_0010e422:
                                    iVar23 = 1;
                                    if (psVar55 < local_1c8) {
                                      (*local_1c0->_vptr_PlayerBase[10])
                                                (local_1c0,local_1b8,&drvInfo);
                                    }
                                    goto LAB_0010ddc7;
                                  }
                                  if (iVar23 == 0x4d5253) {
                                    uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                    uStack_f0 = CONCAT71(uStack_f0._1_7_,(char)uVar43);
                                    goto LAB_0010e422;
                                  }
                                  if (result._M_dataplus._M_p._2_1_ == '\0' && sVar18 == 0x5253) {
                                    uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                    uStack_f0 = CONCAT44((int)uVar43,(UINT32)uStack_f0);
                                    goto LAB_0010e422;
                                  }
                                  if (iVar23 == 0x4d5352) {
                                    uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                    uStack_f0._0_2_ = CONCAT11((char)uVar43,(UINT8)uStack_f0);
                                    goto LAB_0010e422;
                                  }
                                  if (sVar18 == 0x50) {
                                    uVar43 = 0;
                                    psVar44 = (string *)strtok((char *)0x0,",");
                                    if (psVar44 != (string *)0x0) {
                                      uVar50 = 0;
                                      do {
                                        dVar6 = strtod((char *)psVar44,(char **)&local_1c8);
                                        if (psVar44 < local_1c8) {
                                          *(short *)((long)&local_d8 + uVar50 * 2) =
                                               (short)(int)(dVar6 * 256.0);
                                        }
                                        psVar44 = (string *)strtok((char *)0x0,",");
                                        uVar43 = uVar50 + 1;
                                      } while ((psVar44 != (string *)0x0) &&
                                              (bVar56 = uVar50 < 0x1f, uVar50 = uVar43, bVar56));
                                    }
                                    (*local_1c0->_vptr_PlayerBase[10])(local_1c0,local_1b8,&drvInfo)
                                    ;
                                    printf("-> Panning: ");
                                    if ((int)uVar43 != 0) {
                                      uVar50 = uVar43 & 0xffffffff;
                                      do {
                                        printf("%.2f,",SUB84((double)((float)(int)*(short *)((long)&
                                                  local_d8 + uVar50 * 2) * 0.00390625),0));
                                        uVar24 = (int)uVar43 - 1;
                                        uVar43 = (ulong)uVar24;
                                      } while (uVar24 != 0);
                                    }
                                    puts("\b ");
                                    iVar23 = 1;
                                    goto LAB_0010ddc7;
                                  }
                                  if (sVar18 != 0x4d) {
                                    iVar23 = -(uint)(sVar18 == 0x51);
                                    goto LAB_0010ddc7;
                                  }
                                  psVar44 = (string *)strtok((char *)0x0,",");
                                  while (psVar44 != (string *)0x0) {
                                    iVar23 = toupper((uint)*(byte *)&(psVar44->_M_dataplus)._M_p);
                                    if (iVar23 < 0x4f) {
                                      if (iVar23 == 0x44) {
                                        local_e8._4_1_ = 0xff;
                                      }
                                      else if (iVar23 == 0x45) {
                                        local_e8._4_1_ = 0;
                                      }
                                      else {
LAB_0010e5be:
                                        iVar23 = isalnum(iVar23);
                                        if ((iVar23 != 0) &&
                                           (lVar51 = strtol((char *)psVar44,(char **)&local_1c8,0),
                                           psVar44 < local_1c8)) {
                                          local_e8.drvName =
                                               (char *)CONCAT44(local_e8.drvName._4_4_,
                                                                (uint)local_e8.drvName ^
                                                                1 << ((byte)lVar51 & 0x1f));
                                        }
                                      }
                                    }
                                    else if (iVar23 == 0x4f) {
                                      local_e8.drvName =
                                           (char *)((ulong)local_e8.drvName._4_4_ << 0x20);
                                    }
                                    else {
                                      if (iVar23 != 0x58) goto LAB_0010e5be;
                                      local_e8.drvName =
                                           (char *)CONCAT44(local_e8.drvName._4_4_,0xffffffff);
                                    }
                                    psVar44 = (string *)strtok((char *)0x0,",");
                                  }
                                  (*local_1c0->_vptr_PlayerBase[0xc])
                                            (local_1c0,local_1b8,&local_e8.field_0x4);
                                  printf("-> Chip %s [0x%02X], Channel Mask: 0x%02X\n");
                                }
                                iVar23 = 1;
                                goto LAB_0010ddc7;
                              }
                              if (iVar23 == 10) {
                                printf("Command [T/FI/LL/TD data]: ");
                                fgets((char *)&result,0x80,_stdin);
                                psVar44 = (string *)&local_189;
                                do {
                                  p_Var13 = &psVar44->_M_dataplus;
                                  psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                do {
                                  psVar55 = psVar44;
                                  if (psVar55 <= &result) break;
                                  iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2._M_local_buf[0xf]
                                                  );
                                  psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                                } while (iVar23 != 0);
                                *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                                psVar44 = &result;
                                strtok((char *)psVar44," ");
                                if ((byte)result._M_dataplus._M_p != 0) {
                                  psVar44 = &result;
                                  bVar21 = (byte)result._M_dataplus._M_p;
                                  do {
                                    iVar23 = toupper((uint)bVar21);
                                    *(char *)&(psVar44->_M_dataplus)._M_p = (char)iVar23;
                                    bVar21 = *(byte *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                    psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                  } while (bVar21 != 0);
                                }
                                psVar55 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                local_1c8 = psVar44;
                                if (((short)result._M_dataplus._M_p == 0x54) ||
                                   (result._M_dataplus._M_p._2_1_ == '\0' &&
                                    (short)result._M_dataplus._M_p == 0x4946)) {
                                  lVar51 = strtol((char *)psVar55,(char **)&local_1c8,0);
                                  iVar26 = (int)lVar51;
                                  if (local_1c8 == psVar55) {
                                    bVar21 = *(byte *)&(psVar55->_M_dataplus)._M_p;
                                    local_1c8 = psVar55;
                                    if (bVar21 != 0) {
                                      psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 2);
                                      do {
                                        psVar54 = psVar44;
                                        iVar23 = toupper((uint)bVar21);
                                        psVar54[-1].field_2._M_local_buf[0xf] = (char)iVar23;
                                        bVar21 = *(byte *)&(psVar54->_M_dataplus)._M_p;
                                        psVar44 = (string *)((long)&(psVar54->_M_dataplus)._M_p + 1)
                                        ;
                                        local_1c8 = psVar54;
                                      } while (bVar21 != 0);
                                    }
                                    cVar2 = *(char *)&(psVar55->_M_dataplus)._M_p;
                                    iVar26 = 1;
                                    if (((cVar2 != 'E') &&
                                        (iVar23 = strcmp((char *)psVar55,"ON"), iVar23 != 0)) &&
                                       (iVar26 = 0, cVar2 != 'D')) {
                                      iVar23 = strcmp((char *)psVar55,"OFF");
                                      iVar26 = -(uint)(iVar23 != 0);
                                    }
                                  }
                                  iVar23 = 10;
                                  if (-1 < iVar26) {
                                    if ((short)result._M_dataplus._M_p == 0x54) {
                                      showTags = (UINT8)iVar26;
                                    }
                                    else if (result._M_dataplus._M_p._2_1_ == '\0' &&
                                             (short)result._M_dataplus._M_p == 0x4946) {
                                      showFileInfo = iVar26 != 0;
                                    }
                                  }
                                }
                                else if (result._M_dataplus._M_p._2_1_ == '\0' &&
                                         (short)result._M_dataplus._M_p == 0x4c4c) {
                                  uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                  iVar23 = 10;
                                  if (psVar55 < local_1c8) {
                                    logLevel = (UINT8)uVar43;
                                  }
                                }
                                else if (result._M_dataplus._M_p._2_1_ == '\0' &&
                                         (short)result._M_dataplus._M_p == 0x4454) {
                                  uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                  iVar23 = 10;
                                  if (psVar55 < local_1c8) {
                                    pbTimeMode = (UINT8)uVar43;
                                  }
                                }
                                else {
LAB_0010eb16:
                                  iVar23 = -(uint)((short)result._M_dataplus._M_p == 0x51);
                                }
                                goto LAB_0010ddc7;
                              }
                              if (iVar23 == 2) {
                                iVar23 = (*local_1c0->_vptr_PlayerBase[2])();
                                if (iVar23 < 0x53393800) {
                                  if (iVar23 != 0x44524f00) {
                                    if (iVar23 != 0x47594d00) goto LAB_0010e7a9;
                                    pVVar28 = (VGMPlayer *)
                                              __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                             &GYMPlayer::typeinfo);
                                    GYMPlayer::GetPlayerOptions
                                              ((GYMPlayer *)pVVar28,(GYM_PLAY_OPTIONS *)&drvInfo);
                                    printf("Command [SPD data]: ");
                                    fgets((char *)&result,0x80,_stdin);
                                    psVar44 = (string *)&local_189;
                                    do {
                                      p_Var13 = &psVar44->_M_dataplus;
                                      psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                    } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                    do {
                                      psVar55 = psVar44;
                                      if (psVar55 <= &result) break;
                                      iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2._M_local_buf
                                                                   [0xf]);
                                      psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                                    } while (iVar23 != 0);
                                    *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                                    psVar44 = &result;
                                    strtok((char *)psVar44," ");
                                    if ((byte)result._M_dataplus._M_p != 0) {
                                      psVar44 = &result;
                                      bVar21 = (byte)result._M_dataplus._M_p;
                                      do {
                                        iVar23 = toupper((uint)bVar21);
                                        *(char *)&(psVar44->_M_dataplus)._M_p = (char)iVar23;
                                        bVar21 = *(byte *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                        psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1)
                                        ;
                                      } while (bVar21 != 0);
                                    }
                                    goto LAB_0010e953;
                                  }
                                  pVVar28 = (VGMPlayer *)
                                            __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                           &DROPlayer::typeinfo);
                                  DROPlayer::GetPlayerOptions
                                            ((DROPlayer *)pVVar28,(DRO_PLAY_OPTIONS *)&drvInfo);
                                  printf("Command [SPD/OPL3 data]: ");
                                  fgets((char *)&result,0x80,_stdin);
                                  psVar44 = (string *)&local_189;
                                  do {
                                    p_Var13 = &psVar44->_M_dataplus;
                                    psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                  } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                  do {
                                    psVar55 = psVar44;
                                    if (psVar55 <= &result) break;
                                    iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2._M_local_buf
                                                                 [0xf]);
                                    psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                                  } while (iVar23 != 0);
                                  *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                                  psVar44 = &result;
                                  strtok((char *)psVar44," ");
                                  if ((byte)result._M_dataplus._M_p != 0) {
                                    psVar44 = &result;
                                    bVar21 = (byte)result._M_dataplus._M_p;
                                    do {
                                      iVar23 = toupper((uint)bVar21);
                                      *(char *)&(psVar44->_M_dataplus)._M_p = (char)iVar23;
                                      bVar21 = *(byte *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                      psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                    } while (bVar21 != 0);
                                  }
                                  psVar55 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                  local_1c8 = psVar44;
                                  if ((int)result._M_dataplus._M_p != 0x445053) {
                                    if (result._M_dataplus._M_p._4_1_ != '\0' ||
                                        (int)result._M_dataplus._M_p != 0x334c504f)
                                    goto LAB_0010eb0d;
                                    uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                    drvInfo._0_5_ = CONCAT14((char)uVar43,(int)drvInfo);
                                    iVar23 = 2;
                                    if (psVar55 < local_1c8) {
                                      DROPlayer::SetPlayerOptions
                                                ((DROPlayer *)pVVar28,(DRO_PLAY_OPTIONS *)&drvInfo);
                                    }
                                    goto LAB_0010ddc7;
                                  }
                                }
                                else {
                                  if (iVar23 != 0x53393800) {
                                    if (iVar23 == 0x56474d00) {
                                      pVVar28 = (VGMPlayer *)
                                                __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                               &VGMPlayer::typeinfo);
                                      VGMPlayer::GetPlayerOptions
                                                (pVVar28,(VGM_PLAY_OPTIONS *)&drvInfo);
                                      printf("Command [SPD/PHZ/HSO data]: ");
                                      fgets((char *)&result,0x80,_stdin);
                                      psVar44 = (string *)&local_189;
                                      do {
                                        p_Var13 = &psVar44->_M_dataplus;
                                        psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1)
                                        ;
                                      } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                      do {
                                        psVar55 = psVar44;
                                        if (psVar55 <= &result) break;
                                        iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2.
                                                                     _M_local_buf[0xf]);
                                        psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                                      } while (iVar23 != 0);
                                      *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                                      psVar44 = &result;
                                      strtok((char *)psVar44," ");
                                      if ((byte)result._M_dataplus._M_p != 0) {
                                        psVar44 = &result;
                                        bVar21 = (byte)result._M_dataplus._M_p;
                                        do {
                                          iVar23 = toupper((uint)bVar21);
                                          *(char *)&(psVar44->_M_dataplus)._M_p = (char)iVar23;
                                          bVar21 = *(byte *)((long)&(psVar44->_M_dataplus)._M_p + 1)
                                          ;
                                          psVar44 = (string *)
                                                    ((long)&(psVar44->_M_dataplus)._M_p + 1);
                                        } while (bVar21 != 0);
                                      }
                                      psVar55 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                      local_1c8 = psVar44;
                                      if ((int)result._M_dataplus._M_p == 0x5a4850) {
                                        uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                        drvInfo = (AUDDRV_INFO *)CONCAT44((int)uVar43,(int)drvInfo);
                                      }
                                      else {
                                        if ((int)result._M_dataplus._M_p != 0x4f5348) {
                                          if ((int)result._M_dataplus._M_p != 0x445053)
                                          goto LAB_0010eb0d;
                                          goto LAB_0010e968;
                                        }
                                        uVar43 = strtoul((char *)psVar55,(char **)&local_1c8,0);
                                        uStack_f0 = CONCAT71(uStack_f0._1_7_,(char)uVar43);
                                      }
                                      iVar23 = 2;
                                      if (psVar55 < local_1c8) {
                                        iVar23 = 2;
                                        VGMPlayer::SetPlayerOptions
                                                  (pVVar28,(VGM_PLAY_OPTIONS *)&drvInfo);
                                      }
                                    }
                                    else {
LAB_0010e7a9:
                                      puts("No player-specific configuration available.");
                                      iVar23 = 0;
                                    }
                                    goto LAB_0010ddc7;
                                  }
                                  pVVar28 = (VGMPlayer *)
                                            __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                           &S98Player::typeinfo);
                                  S98Player::GetPlayerOptions
                                            ((S98Player *)pVVar28,(S98_PLAY_OPTIONS *)&drvInfo);
                                  printf("Command [SPD data]: ");
                                  fgets((char *)&result,0x80,_stdin);
                                  psVar44 = (string *)&local_189;
                                  do {
                                    p_Var13 = &psVar44->_M_dataplus;
                                    psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                  } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                  do {
                                    psVar55 = psVar44;
                                    if (psVar55 <= &result) break;
                                    iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2._M_local_buf
                                                                 [0xf]);
                                    psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                                  } while (iVar23 != 0);
                                  *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                                  psVar44 = &result;
                                  strtok((char *)psVar44," ");
                                  if ((byte)result._M_dataplus._M_p != 0) {
                                    psVar44 = &result;
                                    bVar21 = (byte)result._M_dataplus._M_p;
                                    do {
                                      iVar23 = toupper((uint)bVar21);
                                      *(char *)&(psVar44->_M_dataplus)._M_p = (char)iVar23;
                                      bVar21 = *(byte *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                      psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                    } while (bVar21 != 0);
                                  }
LAB_0010e953:
                                  local_1c8 = psVar44;
                                  if ((int)result._M_dataplus._M_p != 0x445053) {
LAB_0010eb0d:
                                    goto LAB_0010eb16;
                                  }
                                  psVar55 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                                }
LAB_0010e968:
                                dVar6 = strtod((char *)psVar55,(char **)&local_1c8);
                                iVar23 = 2;
                                if (psVar55 < local_1c8) {
                                  (*(pVVar28->super_PlayerBase)._vptr_PlayerBase[0x11])
                                            (SUB84(dVar6,0),pVVar28);
                                }
                                goto LAB_0010ddc7;
                              }
                              if (iVar23 != 0) goto LAB_0010ddc7;
                              printf("Sound Chip ID: ");
                              fgets((char *)&result,0x80,_stdin);
                              psVar44 = (string *)&local_189;
                              do {
                                p_Var13 = &psVar44->_M_dataplus;
                                psVar44 = (string *)((long)&(psVar44->_M_dataplus)._M_p + 1);
                              } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                              do {
                                psVar55 = psVar44;
                                if (psVar55 <= &result) break;
                                iVar23 = iscntrl((uint)(byte)psVar55[-1].field_2._M_local_buf[0xf]);
                                psVar44 = (string *)((long)&psVar55[-1].field_2 + 0xf);
                              } while (iVar23 != 0);
                              *(undefined1 *)&(psVar55->_M_dataplus)._M_p = 0;
                              iVar23 = 0;
                              if ((byte)result._M_dataplus._M_p == '\0') {
                                bVar56 = true;
                              }
                              else {
                                local_1b8 = (PlayerBase *)
                                            strtoul((char *)&result,(char **)&local_1c8,0);
                                if (&result < local_1c8) {
                                  iVar26 = (*local_1c0->_vptr_PlayerBase[0xb])
                                                     (local_1c0,local_1b8,&drvInfo);
                                  pAVar19 = drvInfo;
                                  if ((char)iVar26 < '\0') {
                                    puts("Invalid sound chip ID.");
                                    bVar56 = false;
                                  }
                                  else {
                                    ppPVar1 = &diList.
                                               super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                    diList.
                                    super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                    _M_impl.super__Vector_impl_data._M_start = (pointer)ppPVar1;
                                    std::__cxx11::string::_M_construct((ulong)&diList,'\x04');
                                    *(char *)&(diList.
                                               super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->id =
                                         (char)((ulong)pAVar19 >> 0x18);
                                    *(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                             ) = (char)((ulong)pAVar19 >> 0x10);
                                    *(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                             ) = (char)((ulong)pAVar19 >> 8);
                                    *(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                             ) = (char)pAVar19;
                                    printf("Cfg: Core %s, Opts 0x%X, srMode 0x%02X, sRate %u, resampleMode 0x%02X\n"
                                           ,diList.
                                            super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                           local_e8._0_8_ & 0xffffffff,uStack_f0 & 0xff,
                                           uStack_f0 >> 0x20,uStack_f0 >> 8 & 0xff);
                                    if (diList.
                                        super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                        ._M_impl.super__Vector_impl_data._M_start !=
                                        (pointer)ppPVar1) {
                                      operator_delete(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (ulong)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 1));
                                    }
                                    bVar56 = false;
                                    printf("Muting: Chip %s [0x%02X], Channel Mask: 0x%02X\n");
                                    iVar23 = 1;
                                  }
                                }
                                else {
                                  iVar23 = toupper((uint)(byte)result._M_dataplus._M_p);
                                  if (iVar23 == 0x44) {
                                    iVar23 = 10;
                                    bVar56 = false;
                                  }
                                  else if (iVar23 == 0x50) {
                                    iVar23 = (*local_1c0->_vptr_PlayerBase[2])();
                                    if (iVar23 < 0x53393800) {
                                      if (iVar23 == 0x44524f00) {
                                        pDVar30 = (DROPlayer *)
                                                  __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                                 &DROPlayer::typeinfo);
                                        DROPlayer::GetPlayerOptions
                                                  (pDVar30,(DRO_PLAY_OPTIONS *)&drvInfo);
                                        printf("Opts: Speed %.3f, OPL3Mode %u\n",
                                               SUB84((double)((ulong)drvInfo & 0xffffffff) *
                                                     1.52587890625e-05,0));
                                      }
                                      else {
                                        if (iVar23 != 0x47594d00) goto LAB_0010eaed;
                                        pGVar31 = (GYMPlayer *)
                                                  __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                                 &GYMPlayer::typeinfo);
                                        GYMPlayer::GetPlayerOptions
                                                  (pGVar31,(GYM_PLAY_OPTIONS *)&drvInfo);
LAB_0010ecda:
                                        printf("Opts: Speed %.3f\n",
                                               SUB84((double)((ulong)drvInfo & 0xffffffff) *
                                                     1.52587890625e-05,0));
                                      }
                                    }
                                    else {
                                      if (iVar23 == 0x53393800) {
                                        pSVar29 = (S98Player *)
                                                  __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                                 &S98Player::typeinfo);
                                        S98Player::GetPlayerOptions
                                                  (pSVar29,(S98_PLAY_OPTIONS *)&drvInfo);
                                        goto LAB_0010ecda;
                                      }
                                      if (iVar23 != 0x56474d00) goto LAB_0010eaed;
                                      pVVar28 = (VGMPlayer *)
                                                __dynamic_cast(local_1c0,&PlayerBase::typeinfo,
                                                               &VGMPlayer::typeinfo);
                                      VGMPlayer::GetPlayerOptions
                                                (pVVar28,(VGM_PLAY_OPTIONS *)&drvInfo);
                                      printf("Opts: Speed %.3f, PlaybkHz %u, HardStopOld %u\n",
                                             SUB84((double)((ulong)drvInfo & 0xffffffff) *
                                                   1.52587890625e-05,0),(ulong)drvInfo >> 0x20,
                                             uStack_f0 & 0xff);
                                    }
                                    bVar56 = false;
                                    iVar23 = 2;
                                  }
                                  else {
LAB_0010eaed:
                                    bVar56 = false;
                                    iVar23 = 0;
                                  }
                                }
                              }
                              if (!bVar56) goto LAB_0010ddc7;
LAB_0010ed0b:
                              drvStruct = (FILE *)0x1;
                              changemode('\x01');
                            }
                            else if (uVar25 == 0x46) {
                              OSMutex_Lock(renderMtx);
                              PlayerA::FadeOut(&mainPlr);
                              drvStruct = (FILE *)renderMtx;
                              OSMutex_Unlock(renderMtx);
                            }
                          }
                          goto LAB_0010dcf3;
                        }
                        OSMutex_Lock(renderMtx);
                        pPVar36 = PlayerA::GetPlayer(&mainPlr);
                        iVar23 = (*pPVar36->_vptr_PlayerBase[0x1e])(pPVar36,2);
                        PlayerA::Seek(&mainPlr,'\x01',((uVar25 & 0xf) * iVar23) / 10);
                      }
                      drvStruct = (FILE *)renderMtx;
                      OSMutex_Unlock(renderMtx);
                      bVar12 = true;
                    }
                  }
LAB_0010dcf3:
                } while ((playState & 2) == 0);
                changemode('\0');
                if (audDrv != (void *)0x0) {
                  AudioDrv_SetCallback(audDrv,(AUDFUNC_FILLBUF)0x0,(void *)0x0);
                }
                pDVar35 = local_38;
                ppcVar52 = local_50;
                if (audDrvLog != (void *)0x0) {
                  if (audDrv != (void *)0x0) {
                    AudioDrv_DataForward_Remove(audDrv,audDrvLog);
                  }
                  AudioDrv_Stop(audDrvLog);
                }
                PlayerA::Stop(&mainPlr);
                PlayerA::UnloadFile(&mainPlr);
                DataLoader_Deinit(pDVar35);
              }
              else {
                main_cold_4();
              }
            }
            else {
              main_cold_3();
            }
          }
          iVar48 = iVar48 + 1;
          if ((int)local_48 <= iVar48) {
            PlayerA::UnregisterAllPlayers(&mainPlr);
            if (audDrv != (void *)0x0) {
              AudioDrv_Stop(audDrv);
            }
            if (locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            DeinitAudioSystem();
            puts("Done.");
            return 0;
          }
        } while( true );
      }
      main_cold_1();
    }
    Audio_Deinit();
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	int argbase;
	UINT8 retVal;
	DATA_LOADER *dLoad;
	int curSong;
	bool needRefresh;
	
	if (argc < 2)
	{
		printf("Usage: %s inputfile\n", argv[0]);
		return 0;
	}
	argbase = 1;
#ifdef _WIN32
	SetConsoleOutputCP(65001);	// set UTF-8 codepage
#endif
	
	retVal = InitAudioSystem();
	if (retVal)
		return 1;
	retVal = StartAudioDevice();
	if (retVal)
	{
		DeinitAudioSystem();
		return 1;
	}
	playState = 0x00;
	
	// I'll keep the instances of the players for the program's life time.
	// This way player/chip options are kept between track changes.
	mainPlr.RegisterPlayerEngine(new VGMPlayer);
	mainPlr.RegisterPlayerEngine(new S98Player);
	mainPlr.RegisterPlayerEngine(new DROPlayer);
	mainPlr.RegisterPlayerEngine(new GYMPlayer);
	mainPlr.SetEventCallback(FilePlayCallback, NULL);
	mainPlr.SetFileReqCallback(RequestFileCallback, NULL);
	mainPlr.SetLogCallback(PlayerLogCallback, NULL);
	//mainPlr.SetOutputSettings() is done in StartAudioDevice()
	{
		PlayerA::Config pCfg = mainPlr.GetConfiguration();
		pCfg.masterVol = masterVol;
		pCfg.loopCount = maxLoops;
		pCfg.fadeSmpls = sampleRate * 4;	// fade over 4 seconds
		pCfg.endSilenceSmpls = sampleRate / 2;	// 0.5 seconds of silence at the end
		pCfg.pbSpeed = 1.0;
		mainPlr.SetConfiguration(pCfg);
	}

	for (curSong = argbase; curSong < argc; curSong ++)
	{
	
	printf("Loading %s ...  ", GetFileTitle(argv[curSong]));
	fflush(stdout);

#ifdef USE_MEMORY_LOADER
	UINT32 fileSize;
	UINT8 *fileData = SlurpFile(argv[curSong],&fileSize);
	dLoad = MemoryLoader_Init(fileData, fileSize);
#else
	dLoad = FileLoader_Init(argv[curSong]);
#endif

	if(dLoad == NULL) continue;
	DataLoader_SetPreloadBytes(dLoad,0x100);
	retVal = DataLoader_Load(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	retVal = mainPlr.LoadFile(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	
	PlayerBase* player = mainPlr.GetPlayer();
	mainPlr.SetLoopCount(maxLoops);
	if (player->GetPlayerType() == FCC_S98)
	{
		S98Player* s98play = dynamic_cast<S98Player*>(player);
		const S98_HEADER* s98hdr = s98play->GetFileHeader();
		
		printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u", s98hdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()),
				s98hdr->tickMult, s98hdr->tickDiv);
	}
	else if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		const VGM_HEADER* vgmhdr = vgmplay->GetFileHeader();
		
		printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s", vgmhdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()));
		mainPlr.SetLoopCount(vgmplay->GetModifiedLoopCount(maxLoops));
	}
	else if (player->GetPlayerType() == FCC_DRO)
	{
		DROPlayer* droplay = dynamic_cast<DROPlayer*>(player);
		const DRO_HEADER* drohdr = droplay->GetFileHeader();
		const char* hwType;
		
		if (drohdr->hwType == 0)
			hwType = "OPL2";
		else if (drohdr->hwType == 1)
			hwType = "DualOPL2";
		else if (drohdr->hwType == 2)
			hwType = "OPL3";
		else
			hwType = "unknown";
		printf("DRO v%u, Total Length: %.2f s, HW Type: %s", drohdr->verMajor,
				player->Tick2Second(player->GetTotalTicks()), hwType);
	}
	
	if (showTags > 0)
	{
		const char* songTitle = NULL;
		const char* songAuthor = NULL;
		const char* songGame = NULL;
		const char* songSystem = NULL;
		const char* songDate = NULL;
		const char* songComment = NULL;
	
		const char* const* tagList = player->GetTags();
		for (const char* const* t = tagList; *t; t += 2)
		{
			if (!strcmp(t[0], "TITLE"))
				songTitle = t[1];
			else if (!strcmp(t[0], "ARTIST"))
				songAuthor = t[1];
			else if (!strcmp(t[0], "GAME"))
				songGame = t[1];
			else if (!strcmp(t[0], "SYSTEM"))
				songSystem = t[1];
			else if (!strcmp(t[0], "DATE"))
				songDate = t[1];
			else if (!strcmp(t[0], "COMMENT"))
				songComment = t[1];
		}
		
		if (songTitle != NULL && songTitle[0] != '\0')
			printf("\nSong Title: %s", songTitle);
		if (showTags >= 2)
		{
			if (songAuthor != NULL && songAuthor[0] != '\0')
				printf("\nSong Author: %s", songAuthor);
			if (songGame != NULL && songGame[0] != '\0')
				printf("\nSong Game: %s", songGame);
			if (songSystem != NULL && songSystem[0] != '\0')
				printf("\nSong System: %s", songSystem);
			if (songDate != NULL && songDate[0] != '\0')
				printf("\nSong Date: %s", songDate);
			if (songComment != NULL && songComment[0] != '\0')
				printf("\nSong Comment: %s", songComment);
		}
	}
	
	putchar('\n');
	
	{
		PLR_DEV_OPTS devOpts;
		UINT32 devOptID;
		
		devOptID = PLR_DEV_ID(DEVID_SN76496, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[4] = {0x00, -0x80, +0x80, 0x00};
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAXM;
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_YM2413, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[14] = {
				-0x100, +0x100, -0x80, +0x80, -0x40, +0x40, -0xC0, +0xC0, 0x00,
				-0x60, +0x60, 0x00, -0xC0, +0xC0};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_AY8910, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[3] = {-0x80, +0x80, 0x00};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}

		devOptID = PLR_DEV_ID(DEVID_C6280, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAME;
			player->SetDeviceOptions(devOptID, devOpts);
		}
	}
	
	mainPlr.Start();
	
	if (showFileInfo)
	{
		// only after calling PlayerA::Start() we can obtain info about the currently used sound cores
		PLR_SONG_INFO sInf;
		std::vector<PLR_DEV_INFO> diList;
		size_t curDev;
		
		player->GetSongInfo(sInf);
		player->GetSongDeviceInfo(diList);
		printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
			FCC2Str(sInf.format).c_str(), sInf.fileVerMaj, sInf.fileVerMin,
			sInf.tickRateMul, sInf.tickRateDiv, sInf.songLen, sInf.loopTick, sInf.deviceCnt);
		for (curDev = 0; curDev < diList.size(); curDev ++)
		{
			const PLR_DEV_INFO& pdi = diList[curDev];
			printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
				(int)pdi.id, pdi.type, (INT8)pdi.instance, FCC2Str(pdi.core).c_str(), pdi.devCfg->clock, pdi.smplRate, pdi.volume);
		}
	}
	const std::vector<VGMPlayer::DACSTRM_DEV>* vgmPcmStrms = NULL;
	if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		vgmPcmStrms = &vgmplay->GetStreamDevInfo();
	}
	
	StartDiskWriter("waveOut.wav");
	
	if (audDrv != NULL)
		retVal = AudioDrv_SetCallback(audDrv, FillBuffer, &mainPlr);
	else
		retVal = 0xFF;
	manualRenderLoop = (retVal != 0x00);
#ifndef _WIN32
	changemode(1);
#endif
	playState &= ~PLAYSTATE_END;
	needRefresh = true;
	while(! (playState & PLAYSTATE_END))
	{
		if (! (playState & PLAYSTATE_PAUSE))
			needRefresh = true;	// always update when playing
		if (needRefresh)
		{
			const char* pState;
			
			if (playState & PLAYSTATE_PAUSE)
				pState = "Paused";
			else if (mainPlr.GetState() & PLAYSTATE_END)
				pState = "Finish ";
			else if (mainPlr.GetState() & PLAYSTATE_FADE)
				pState = "Fading ";
			else
				pState = "Playing";
			if (vgmPcmStrms == NULL || vgmPcmStrms->empty())
			{
				printf("%s %.2f / %.2f ...   \r", pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode));
			}
			else
			{
				const VGMPlayer::DACSTRM_DEV* strmDev = &(*vgmPcmStrms)[0];
				std::string pbMode = " ";
				if (strmDev->pbMode & 0x10)
					pbMode += 'R';	// reverse playback
				if (strmDev->pbMode & 0x80)
					pbMode += 'L';	// looping
				if (pbMode.length() == 1)
					pbMode = "";
				printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",
					pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode),
					1 + strmDev->lastItem, strmDev->maxItems, strmDev->freq / 1000.0,
					pbMode.c_str());
			}
			fflush(stdout);
			needRefresh = false;
		}
		
		if (manualRenderLoop && ! (playState & PLAYSTATE_PAUSE))
		{
			UINT32 wrtBytes = FillBuffer(audDrvLog, &mainPlr, (UINT32)locAudBuf.size(), &locAudBuf[0]);
			AudioDrv_WriteData(audDrvLog, wrtBytes, &locAudBuf[0]);
		}
		else
		{
			Sleep(50);
		}
		
		if (_kbhit())
		{
			int inkey = _getch();
			int letter = toupper(inkey);
			
			if (letter == ' ' || letter == 'P')
			{
				playState ^= PLAYSTATE_PAUSE;
				if (audDrv != NULL)
				{
					if (playState & PLAYSTATE_PAUSE)
						AudioDrv_Pause(audDrv);
					else
						AudioDrv_Resume(audDrv);
				}
			}
			else if (letter == 'R')	// restart
			{
				OSMutex_Lock(renderMtx);
				mainPlr.Reset();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter >= '0' && letter <= '9')
			{
				UINT32 maxPos;
				UINT8 pbPos10;
				UINT32 destPos;
				
				OSMutex_Lock(renderMtx);
				maxPos = mainPlr.GetPlayer()->GetTotalPlayTicks(maxLoops);
				pbPos10 = letter - '0';
				destPos = maxPos * pbPos10 / 10;
				mainPlr.Seek(PLAYPOS_TICK, destPos);
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'B')	// previous file
			{
				if (curSong > argbase)
				{
					playState |= PLAYSTATE_END;
					curSong -= 2;
				}
			}
			else if (letter == 'N')	// next file
			{
				if (curSong + 1 < argc)
					playState |= PLAYSTATE_END;
			}
			else if (inkey == 0x1B || letter == 'Q')	// quit
			{
				playState |= PLAYSTATE_END;
				curSong = argc - 1;
			}
			else if (letter == 'F')	// fade out
			{
				OSMutex_Lock(renderMtx);
				mainPlr.FadeOut();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'C')	// chip control
			{
#ifndef _WIN32
				changemode(0);	// make sure entered charactered are echoed
#endif
				DoChipControlMode(mainPlr.GetPlayer());
#ifndef _WIN32
				changemode(1);
#endif
			}
			needRefresh = true;
		}
	}
#ifndef _WIN32
	changemode(0);
#endif
	// remove callback to prevent further rendering
	// also waits for render thread to finish its work
	if (audDrv != NULL)
		AudioDrv_SetCallback(audDrv, NULL, NULL);
	
	StopDiskWriter();
	
	mainPlr.Stop();
	mainPlr.UnloadFile();
	DataLoader_Deinit(dLoad);	dLoad = NULL;
#ifdef USE_MEMORY_LOADER
	free(fileData);
#endif
	
	}	// end for(curSong)
	
	mainPlr.UnregisterAllPlayers();
	
	StopAudioDevice();
	DeinitAudioSystem();
	printf("Done.\n");
	
#if defined(_DEBUG) && (_MSC_VER >= 1400)
	// doesn't work well with C++ containers
	//if (_CrtDumpMemoryLeaks())
	//	_getch();
#endif
	
	return 0;
}